

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_cast.hpp
# Opt level: O3

bool duckdb::HandleVectorCastError::Operation<bool>
               (string *error_message,ValidityMask *mask,idx_t idx,VectorTryCastData *cast_data)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  _Head_base<0UL,_unsigned_long_*,_false> _Var5;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  idx_t local_28;
  
  HandleCastError::AssignError
            (error_message,cast_data->parameters->error_message,
             (optional_idx)(cast_data->parameters->query_location).index);
  cast_data->all_converted = false;
  _Var5._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (_Var5._M_head_impl == (unsigned_long *)0x0) {
    local_28 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_38,&local_28);
    p_Var3 = p_Stack_30;
    peVar2 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar2;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
    }
    pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
    _Var5._M_head_impl =
         (pTVar4->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var5._M_head_impl;
  }
  bVar1 = (byte)idx & 0x3f;
  _Var5._M_head_impl[idx >> 6] =
       _Var5._M_head_impl[idx >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
  return false;
}

Assistant:

static RESULT_TYPE Operation(const string &error_message, ValidityMask &mask, idx_t idx,
	                             VectorTryCastData &cast_data) {
		HandleCastError::AssignError(error_message, cast_data.parameters);
		cast_data.all_converted = false;
		mask.SetInvalid(idx);
		return NullValue<RESULT_TYPE>();
	}